

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_loop::statement_loop
          (statement_loop *this,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b,context_t *c,
          token_base *ptr)

{
  token_base *in_RDX;
  statement_base *in_RDI;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff98;
  context_t *c_00;
  context_t local_30 [3];
  
  c_00 = local_30;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RDX,
             (shared_ptr<cs::context_type> *)in_stack_ffffffffffffff98);
  statement_base::statement_base(in_RDI,c_00,in_RDX);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x242a41);
  in_RDI->_vptr_statement_base = (_func_int **)&PTR__statement_loop_003be550;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDX,
             in_stack_ffffffffffffff98);
  return;
}

Assistant:

statement_loop(std::deque<statement_base *> b, context_t c, token_base *ptr)
			: statement_base(std::move(c), ptr), mBlock(std::move(b)) {}